

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test_content.h
# Opt level: O3

void __thiscall data::form_test::form_test(form_test *this)

{
  form *this_00;
  text *this_01;
  long lVar1;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  master::master(&this->super_master);
  *(undefined ***)&this->super_master = &PTR__form_test_0011ac78;
  this_00 = &this->f;
  cppcms::form::form(this_00);
  this_01 = &this->t1;
  cppcms::widgets::text::text(this_01);
  cppcms::widgets::text::text(&this->t2);
  cppcms::form::add((base_widget *)this_00);
  cppcms::form::add((base_widget *)this_00);
  lVar1 = *(long *)(*(long *)this_01 + -0x18);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"msg","");
  cppcms::widgets::base_widget::message(this_01 + lVar1,local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  lVar1 = *(long *)(*(long *)this_01 + -0x18);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"help","");
  cppcms::widgets::base_widget::help(this_01 + lVar1,local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

form_test()
		{
			f.add(t1);
			f.add(t2);
			t1.message("msg");
			t1.help("help");
		}